

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<8,_2,_13,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  Matrix<float,_4,_4> *mat;
  Matrix<float,_4,_4> *mat_00;
  MatrixCaseUtils local_15c [12];
  MatrixCaseUtils local_150 [12];
  tcu local_144 [12];
  VecAccess<float,_4,_3> local_138;
  MatrixCaseUtils local_120 [64];
  Matrix<float,_4,_4> local_e0;
  MatrixCaseUtils local_a0 [64];
  Matrix<float,_4,_4> local_60;
  
  getInputValue<2,13>((Mat4 *)local_a0,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  decrement<float,4,4>(&local_60,local_a0,mat);
  reduceToVec3(local_150,&local_60);
  getInputValue<2,13>((Mat4 *)local_120,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  decrement<float,4,4>(&local_e0,local_120,mat_00);
  reduceToVec3(local_15c,&local_e0);
  tcu::operator+(local_144,(Vector<float,_3> *)local_150,(Vector<float,_3> *)local_15c);
  local_138.m_vector = &evalCtx->color;
  local_138.m_index[0] = 0;
  local_138.m_index[1] = 1;
  local_138.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_138,(Vector<float,_3> *)local_144);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0))) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}